

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memvar_propagation.hpp
# Opt level: O3

void __thiscall
optimization::memvar_propagation::Memory_Var_Propagation::optimize_func
          (Memory_Var_Propagation *this,MirFunction *func)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  iterator iVar6;
  _Base_ptr p_Var7;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  long lVar11;
  variant_alternative_t<0UL,_variant<int,_VarId>_> *pvVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  long lVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  _Self __tmp_4;
  ulong uVar19;
  _Self __tmp;
  _Base_ptr p_Var20;
  long lVar21;
  variant<int,_mir::inst::VarId> *pvVar22;
  uint *puVar23;
  _Base_ptr p_Var24;
  _Self __tmp_1;
  VarId *__storage_13;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  int index;
  _Self __tmp_2;
  vector<int,_std::allocator<int>_> call_index;
  variant<int,_mir::inst::VarId> value;
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  reg_load;
  vector<int,_std::allocator<int>_> del_index;
  _Self __tmp_5;
  map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
  load;
  map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
  store;
  int local_1b4;
  _Base_ptr local_1b0;
  vector<int,_std::allocator<int>_> local_1a8;
  _Variadic_union<int,_mir::inst::VarId> local_190;
  undefined1 local_180;
  _Base_ptr local_178;
  _Base_ptr local_170;
  _Base_ptr local_168;
  undefined1 local_160 [16];
  _Variadic_union<int,_mir::inst::VarId> local_150;
  undefined1 local_140;
  _Base_ptr local_138;
  _Base_ptr local_130;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  local_128;
  void *local_f8;
  iterator iStack_f0;
  int *local_e8;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  anon_class_8_1_a78179b7_conflict local_c0;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
  local_b8;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
  local_88;
  MirFunction *local_58;
  _Base_ptr local_50;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_128._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b0 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_1b0 != local_d8) {
    local_48 = &this->unaffected_call;
    local_50 = &(this->unaffected_call)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var1 = &local_b8._M_impl.super__Rb_tree_header;
    local_d0 = (_Base_ptr)&PTR_display_001ecfe8;
    local_138 = (_Base_ptr)&PTR_display_001ed108;
    local_38 = (_Base_ptr)&PTR_display_001ed048;
    local_130 = (_Base_ptr)&PTR_display_001ed1c8;
    local_178 = (_Base_ptr)&PTR_display_001ed288;
    local_40 = (_Base_ptr)&PTR_display_001ed348;
    local_58 = func;
    do {
      local_1b4 = 0;
      local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_88._M_impl._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_1a8,(iterator)0x0,(int *)&local_88);
      p_Var15 = local_1b0[3]._M_left;
      for (p_Var14 = local_1b0[3]._M_parent; p_Var14 != p_Var15;
          p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
        plVar4 = *(long **)p_Var14;
        p_Var7 = (_Base_ptr)*plVar4;
        if (p_Var7 == local_138) {
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_48->_M_t,(key_type *)(plVar4 + 3));
          if (iVar6._M_node == local_50) {
            local_88._M_impl._0_4_ = local_1b4 + 1;
            if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_1a8,
                         (iterator)
                         local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_88);
            }
            else {
              *local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_88._M_impl._0_4_;
              local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          p_Var7 = (_Base_ptr)*plVar4;
        }
        if (p_Var7 == local_178) {
          if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_1a8,
                       (iterator)
                       local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1b4);
          }
          else {
            *local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_1b4;
            local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        local_1b4 = local_1b4 + 1;
      }
      local_f8 = (void *)0x0;
      iStack_f0._M_current = (int *)0x0;
      local_e8 = (int *)0x0;
      if ((long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        uVar19 = 0;
      }
      else {
        p_Var14 = (_Base_ptr)
                  ((long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
        p_Var15 = (_Base_ptr)0x0;
        do {
          if ((_Base_ptr)((long)&p_Var14[-1]._M_right + 7) == p_Var15) {
            p_Var14 = local_1b0[3]._M_parent;
            p_Var7 = local_1b0[3]._M_left;
            local_170 = (_Base_ptr)((ulong)((long)p_Var7 - (long)p_Var14) >> 3);
          }
          else {
            local_170 = (_Base_ptr)
                        (ulong)(uint)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start
                                     [(long)((long)&p_Var15->_M_color + 1)];
            p_Var14 = local_1b0[3]._M_parent;
            p_Var7 = local_1b0[3]._M_left;
          }
          local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_88._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_88._M_impl.super__Rb_tree_header._M_header;
          local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1b4 = 0;
          local_168 = p_Var15;
          local_b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          local_88._M_impl.super__Rb_tree_header._M_header._M_right =
               local_88._M_impl.super__Rb_tree_header._M_header._M_left;
          if (p_Var14 != p_Var7) {
            do {
              if ((local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)local_168] <= local_1b4) &&
                 (local_1b4 < (int)local_170)) {
                plVar4 = *(long **)p_Var14;
                if ((_Base_ptr)*plVar4 == local_178) {
                  local_190._0_8_ = local_190._0_8_ & 0xffffffff00000000;
                  local_180 = '\0';
                  if ((char)plVar4[6] == '\x01') {
                    pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                       ((variant<int,_mir::inst::VarId> *)(plVar4 + 4));
                    local_190._0_8_ = &PTR_display_001eb100;
                    local_190._8_4_ = pvVar8->id;
                    local_180 = _S_black;
                    std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)&local_190)
                    ;
                  }
                  else {
                    pvVar12 = std::get<0ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)(plVar4 + 4));
                    local_190._M_first._M_storage = (_Uninitialized<int,_true>)*pvVar12;
                    local_180 = _S_red;
                    std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)&local_190)
                    ;
                  }
                  uVar2 = *(uint *)(plVar4 + 2);
                  if (local_88._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
                  {
                    p_Var15 = local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var20 = &local_88._M_impl.super__Rb_tree_header._M_header;
                    do {
                      p_Var18 = p_Var20;
                      p_Var17 = p_Var15;
                      uVar3 = *(uint *)&p_Var17[1]._M_parent;
                      p_Var20 = p_Var17;
                      if (uVar3 < uVar2) {
                        p_Var20 = p_Var18;
                      }
                      p_Var15 = (&p_Var17->_M_left)[uVar3 < uVar2];
                    } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                    if ((_Rb_tree_header *)p_Var20 != &local_88._M_impl.super__Rb_tree_header) {
                      if (uVar3 < uVar2) {
                        p_Var17 = p_Var18;
                      }
                      if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                        local_160._0_8_ =
                             std::
                             map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                             ::operator[]((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                           *)&local_88,(key_type *)(plVar4 + 1));
                        (*std::__detail::__variant::
                          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                          ::_S_vtable._M_arr[(long)(char)local_180 + 1]._M_data)
                                  ((anon_class_8_1_8991fb9c_conflict *)local_160,
                                   (variant<int,_mir::inst::VarId> *)&local_190);
                        goto LAB_0013516a;
                      }
                    }
                  }
                  local_160._0_8_ = &PTR_display_001eb100;
                  local_140 = local_180;
                  local_c0.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_150;
                  local_160._8_4_ = uVar2;
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr[(long)(char)local_180 + 1]._M_data)
                            (&local_c0,(variant<int,_mir::inst::VarId> *)&local_190);
                  std::
                  _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>>
                  ::
                  _M_insert_unique<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>
                            ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>>
                              *)&local_88,
                             (pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_> *)
                             local_160);
                }
                else if (((_Base_ptr)*plVar4 == local_130) && ((char)plVar4[6] == '\x01')) {
                  pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                     ((variant<int,_mir::inst::VarId> *)(plVar4 + 4));
                  if (local_88._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
                  {
                    uVar2 = pvVar8->id;
                    p_Var15 = &local_88._M_impl.super__Rb_tree_header._M_header;
                    p_Var20 = local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
                    do {
                      p_Var17 = p_Var20;
                      p_Var18 = p_Var15;
                      uVar3 = *(uint *)&p_Var17[1]._M_parent;
                      p_Var15 = p_Var17;
                      if (uVar3 < uVar2) {
                        p_Var15 = p_Var18;
                      }
                      p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
                    } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                    if ((_Rb_tree_header *)p_Var15 != &local_88._M_impl.super__Rb_tree_header) {
                      if (uVar3 < uVar2) {
                        p_Var17 = p_Var18;
                      }
                      if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                        uVar2 = *(uint *)(plVar4 + 2);
                        if (local_b8._M_impl.super__Rb_tree_header._M_header._M_parent ==
                            (_Base_ptr)0x0) {
LAB_0013520a:
                          local_160._0_8_ = &PTR_display_001eb100;
                          local_140 = (undefined1)p_Var15[2]._M_color;
                          local_190._0_8_ = &local_150;
                          local_160._8_4_ = uVar2;
                          (*std::__detail::__variant::
                            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                            ::_S_vtable._M_arr[(long)(char)local_140 + 1]._M_data)
                                    ((anon_class_8_1_a78179b7_conflict *)&local_190,
                                     (variant<int,_mir::inst::VarId> *)&p_Var15[1]._M_left);
                          std::
                          _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>>
                          ::
                          _M_insert_unique<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>
                                    ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>>
                                      *)&local_b8,
                                     (pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>
                                      *)local_160);
                          if ((char)p_Var15[2]._M_color == _S_black) {
                            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                               ((variant<int,_mir::inst::VarId> *)
                                                &p_Var15[1]._M_left);
                            local_160._0_8_ = &PTR_display_001eb100;
                            local_160._8_4_ = *(undefined4 *)(plVar4 + 2);
                            local_150._0_8_ = &PTR_display_001eb100;
                            local_150._8_4_ = pvVar8->id;
                            std::
                            _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
                            ::_M_insert_unique<std::pair<mir::inst::VarId_const,mir::inst::VarId>>
                                      ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
                                        *)&local_128,
                                       (pair<const_mir::inst::VarId,_mir::inst::VarId> *)local_160);
                          }
                        }
                        else {
                          p_Var20 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                          p_Var17 = &p_Var1->_M_header;
                          do {
                            p_Var24 = p_Var17;
                            p_Var18 = p_Var20;
                            uVar3 = *(uint *)&p_Var18[1]._M_parent;
                            p_Var17 = p_Var18;
                            if (uVar3 < uVar2) {
                              p_Var17 = p_Var24;
                            }
                            p_Var20 = (&p_Var18->_M_left)[uVar3 < uVar2];
                          } while ((&p_Var18->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                          if ((_Rb_tree_header *)p_Var17 == p_Var1) goto LAB_0013520a;
                          if (uVar3 < uVar2) {
                            p_Var18 = p_Var24;
                          }
                          if (uVar2 < *(uint *)&p_Var18[1]._M_parent) goto LAB_0013520a;
                          local_160._0_8_ =
                               std::
                               map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                               ::operator[]((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                             *)&local_b8,(key_type *)(plVar4 + 1));
                          (*std::__detail::__variant::
                            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                            ::_S_vtable._M_arr[(long)(char)p_Var15[2]._M_color + 1]._M_data)
                                    ((anon_class_8_1_8991fb9c_conflict *)local_160,
                                     (variant<int,_mir::inst::VarId> *)&p_Var15[1]._M_left);
                        }
                        if ((char)p_Var15[2]._M_color == _S_black) {
                          if (iStack_f0._M_current == local_e8) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)&local_f8,iStack_f0,
                                       &local_1b4);
                          }
                          else {
                            *iStack_f0._M_current = local_1b4;
                            iStack_f0._M_current = iStack_f0._M_current + 1;
                          }
                        }
                        goto LAB_0013516a;
                      }
                    }
                  }
                  local_190._0_8_ = &PTR_display_001eb100;
                  local_190._8_4_ = *(undefined4 *)(plVar4 + 2);
                  local_180 = _S_black;
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)&local_190);
                  if ((char)plVar4[6] == '\x01') {
                    pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                       ((variant<int,_mir::inst::VarId> *)(plVar4 + 4));
                    local_160._0_8_ = &PTR_display_001eb100;
                    local_160._8_4_ = pvVar8->id;
                    local_140 = local_180;
                    local_c0.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_150;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)local_180 + 1]._M_data)
                              (&local_c0,(variant<int,_mir::inst::VarId> *)&local_190);
                    std::
                    _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>>
                    ::
                    _M_insert_unique<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>
                              ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::variant<int,mir::inst::VarId>>>>
                                *)&local_88,
                               (pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_> *
                               )local_160);
                  }
                }
              }
LAB_0013516a:
              local_1b4 = local_1b4 + 1;
              p_Var14 = (_Base_ptr)&p_Var14->_M_parent;
            } while (p_Var14 != p_Var7);
            p_Var10 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var9 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
            while (local_b8._M_impl.super__Rb_tree_header._M_header._M_left = p_Var9,
                  (_Rb_tree_header *)p_Var10 != p_Var1) {
              if ((_Rb_tree_header *)p_Var9 != p_Var1) {
                do {
                  if (((char)p_Var9[2]._M_color == _S_black) &&
                     (pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                         ((variant<int,_mir::inst::VarId> *)&p_Var9[1]._M_left),
                     *(uint32_t *)&p_Var10[1]._M_parent == pvVar8->id)) {
                    local_160._0_8_ =
                         std::
                         map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                         ::operator[]((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                       *)&local_b8,(key_type *)(p_Var9 + 1));
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)p_Var10[2]._M_color + 1]._M_data)
                              ((anon_class_8_1_8991fb9c_conflict *)local_160,
                               (variant<int,_mir::inst::VarId> *)&p_Var10[1]._M_left);
                  }
                  p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
                } while ((_Rb_tree_header *)p_Var9 != p_Var1);
              }
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
              p_Var9 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
            }
          }
          local_1b4 = 0;
          p_Var14 = local_1b0[3]._M_parent;
          local_c8 = local_1b0[3]._M_left;
          if (p_Var14 != local_c8) {
            do {
              if ((local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)local_168] <= local_1b4) &&
                 (local_1b4 < (int)local_170)) {
                puVar5 = *(undefined8 **)p_Var14;
                p_Var15 = (_Base_ptr)*puVar5;
                if (p_Var15 == local_d0) {
                  if (*(char *)(puVar5 + 6) == '\x01') {
                    pvVar22 = (variant<int,_mir::inst::VarId> *)(puVar5 + 4);
                    pvVar8 = std::get<1ul,int,mir::inst::VarId>(pvVar22);
                    if (local_b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0
                       ) {
                      uVar2 = pvVar8->id;
                      p_Var15 = &p_Var1->_M_header;
                      p_Var7 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                      do {
                        p_Var20 = p_Var7;
                        p_Var17 = p_Var15;
                        uVar3 = *(uint *)&p_Var20[1]._M_parent;
                        p_Var15 = p_Var20;
                        if (uVar3 < uVar2) {
                          p_Var15 = p_Var17;
                        }
                        p_Var7 = (&p_Var20->_M_left)[uVar3 < uVar2];
                      } while ((&p_Var20->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
                        if (uVar3 < uVar2) {
                          p_Var20 = p_Var17;
                        }
                        if (*(uint *)&p_Var20[1]._M_parent <= uVar2) {
                          if ((char)p_Var15[2]._M_color == _S_red) {
                            pvVar12 = std::get<0ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 &p_Var15[1]._M_left);
                            *(variant_alternative_t<0UL,_variant<int,_VarId>_> *)(puVar5 + 4) =
                                 *pvVar12;
                            *(undefined1 *)(puVar5 + 6) = 0;
                            std::get<0ul,int,mir::inst::VarId>(pvVar22);
                          }
                          else {
                            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                               ((variant<int,_mir::inst::VarId> *)
                                                &p_Var15[1]._M_left);
                            puVar5[4] = &PTR_display_001eb100;
                            *(uint32_t *)(puVar5 + 5) = pvVar8->id;
                            *(undefined1 *)(puVar5 + 6) = 1;
                            std::get<1ul,int,mir::inst::VarId>(pvVar22);
                          }
                        }
                      }
                    }
                  }
                }
                else if (p_Var15 == local_138) {
                  lVar11 = puVar5[7];
                  if (puVar5[8] != lVar11) {
                    uVar19 = 0;
                    do {
                      lVar16 = uVar19 * 0x20;
                      if ((*(char *)(lVar11 + 0x18 + lVar16) == '\x01') &&
                         (pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                             ((variant<int,_mir::inst::VarId> *)
                                              (lVar11 + lVar16 + 8)),
                         local_b8._M_impl.super__Rb_tree_header._M_header._M_parent !=
                         (_Base_ptr)0x0)) {
                        uVar2 = pvVar8->id;
                        p_Var15 = &p_Var1->_M_header;
                        p_Var7 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                        do {
                          p_Var20 = p_Var7;
                          p_Var17 = p_Var15;
                          uVar3 = *(uint *)&p_Var20[1]._M_parent;
                          p_Var15 = p_Var20;
                          if (uVar3 < uVar2) {
                            p_Var15 = p_Var17;
                          }
                          p_Var7 = (&p_Var20->_M_left)[uVar3 < uVar2];
                        } while ((&p_Var20->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                        if ((_Rb_tree_header *)p_Var15 != p_Var1) {
                          if (uVar3 < uVar2) {
                            p_Var20 = p_Var17;
                          }
                          if (*(uint *)&p_Var20[1]._M_parent <= uVar2) {
                            lVar11 = puVar5[7];
                            if ((char)p_Var15[2]._M_color == _S_red) {
                              pvVar12 = std::get<0ul,int,mir::inst::VarId>
                                                  ((variant<int,_mir::inst::VarId> *)
                                                   &p_Var15[1]._M_left);
                              lVar16 = lVar16 + lVar11;
                              pvVar22 = (variant<int,_mir::inst::VarId> *)(lVar16 + 8);
                              *(variant_alternative_t<0UL,_variant<int,_VarId>_> *)
                               &(pvVar22->super__Variant_base<int,_mir::inst::VarId>).
                                super__Move_assign_alias<int,_mir::inst::VarId>.
                                super__Copy_assign_alias<int,_mir::inst::VarId>.
                                super__Move_ctor_alias<int,_mir::inst::VarId>.
                                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u = *pvVar12;
                              *(undefined1 *)(lVar16 + 0x18) = 0;
                              std::get<0ul,int,mir::inst::VarId>(pvVar22);
                            }
                            else {
                              pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                                 ((variant<int,_mir::inst::VarId> *)
                                                  &p_Var15[1]._M_left);
                              lVar16 = lVar16 + lVar11;
                              *(undefined ***)
                               &(((variant<int,_mir::inst::VarId> *)(lVar16 + 8))->
                                super__Variant_base<int,_mir::inst::VarId>).
                                super__Move_assign_alias<int,_mir::inst::VarId>.
                                super__Copy_assign_alias<int,_mir::inst::VarId>.
                                super__Move_ctor_alias<int,_mir::inst::VarId>.
                                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u =
                                   &PTR_display_001eb100;
                              *(uint32_t *)(lVar16 + 0x10) = pvVar8->id;
                              *(undefined1 *)(lVar16 + 0x18) = 1;
                              std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)(lVar16 + 8));
                            }
                          }
                        }
                      }
                      uVar19 = uVar19 + 1;
                      lVar11 = puVar5[7];
                    } while (uVar19 < (ulong)(puVar5[8] - lVar11 >> 5));
                  }
                }
                else if (p_Var15 == local_38) {
                  if (*(char *)(puVar5 + 6) == '\x01') {
                    pvVar22 = (variant<int,_mir::inst::VarId> *)(puVar5 + 4);
                    pvVar8 = std::get<1ul,int,mir::inst::VarId>(pvVar22);
                    if (local_b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0
                       ) {
                      uVar2 = pvVar8->id;
                      p_Var15 = &p_Var1->_M_header;
                      p_Var7 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                      do {
                        p_Var20 = p_Var7;
                        p_Var17 = p_Var15;
                        uVar3 = *(uint *)&p_Var20[1]._M_parent;
                        p_Var15 = p_Var20;
                        if (uVar3 < uVar2) {
                          p_Var15 = p_Var17;
                        }
                        p_Var7 = (&p_Var20->_M_left)[uVar3 < uVar2];
                      } while ((&p_Var20->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
                        if (uVar3 < uVar2) {
                          p_Var20 = p_Var17;
                        }
                        if (*(uint *)&p_Var20[1]._M_parent <= uVar2) {
                          if ((char)p_Var15[2]._M_color == _S_red) {
                            pvVar12 = std::get<0ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 &p_Var15[1]._M_left);
                            *(variant_alternative_t<0UL,_variant<int,_VarId>_> *)(puVar5 + 4) =
                                 *pvVar12;
                            *(undefined1 *)(puVar5 + 6) = 0;
                            std::get<0ul,int,mir::inst::VarId>(pvVar22);
                          }
                          else {
                            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                               ((variant<int,_mir::inst::VarId> *)
                                                &p_Var15[1]._M_left);
                            puVar5[4] = &PTR_display_001eb100;
                            *(uint32_t *)(puVar5 + 5) = pvVar8->id;
                            *(undefined1 *)(puVar5 + 6) = 1;
                            std::get<1ul,int,mir::inst::VarId>(pvVar22);
                          }
                        }
                      }
                    }
                  }
                  if (*(char *)(puVar5 + 10) == '\x01') {
                    pvVar22 = (variant<int,_mir::inst::VarId> *)(puVar5 + 8);
                    pvVar8 = std::get<1ul,int,mir::inst::VarId>(pvVar22);
                    if (local_b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0
                       ) {
                      uVar2 = pvVar8->id;
                      p_Var15 = &p_Var1->_M_header;
                      p_Var7 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                      do {
                        p_Var20 = p_Var7;
                        p_Var17 = p_Var15;
                        uVar3 = *(uint *)&p_Var20[1]._M_parent;
                        p_Var15 = p_Var20;
                        if (uVar3 < uVar2) {
                          p_Var15 = p_Var17;
                        }
                        p_Var7 = (&p_Var20->_M_left)[uVar3 < uVar2];
                      } while ((&p_Var20->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
                        if (uVar3 < uVar2) {
                          p_Var20 = p_Var17;
                        }
                        if (*(uint *)&p_Var20[1]._M_parent <= uVar2) {
                          if ((char)p_Var15[2]._M_color == _S_red) {
                            pvVar12 = std::get<0ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 &p_Var15[1]._M_left);
                            *(variant_alternative_t<0UL,_variant<int,_VarId>_> *)(puVar5 + 8) =
                                 *pvVar12;
                            *(undefined1 *)(puVar5 + 10) = 0;
                            std::get<0ul,int,mir::inst::VarId>(pvVar22);
                          }
                          else {
                            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                               ((variant<int,_mir::inst::VarId> *)
                                                &p_Var15[1]._M_left);
                            puVar5[8] = &PTR_display_001eb100;
                            *(uint32_t *)(puVar5 + 9) = pvVar8->id;
                            *(undefined1 *)(puVar5 + 10) = 1;
                            std::get<1ul,int,mir::inst::VarId>(pvVar22);
                          }
                        }
                      }
                    }
                  }
                }
                else if (p_Var15 == local_130) {
                  if (*(char *)(puVar5 + 6) == '\x01') {
                    pvVar22 = (variant<int,_mir::inst::VarId> *)(puVar5 + 4);
                    pvVar8 = std::get<1ul,int,mir::inst::VarId>(pvVar22);
                    if (local_b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0
                       ) {
                      uVar2 = pvVar8->id;
                      p_Var15 = &p_Var1->_M_header;
                      p_Var7 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                      do {
                        p_Var20 = p_Var7;
                        p_Var17 = p_Var15;
                        uVar3 = *(uint *)&p_Var20[1]._M_parent;
                        p_Var15 = p_Var20;
                        if (uVar3 < uVar2) {
                          p_Var15 = p_Var17;
                        }
                        p_Var7 = (&p_Var20->_M_left)[uVar3 < uVar2];
                      } while ((&p_Var20->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
                        if (uVar3 < uVar2) {
                          p_Var20 = p_Var17;
                        }
                        if (*(uint *)&p_Var20[1]._M_parent <= uVar2) {
                          if ((char)p_Var15[2]._M_color == _S_red) {
                            pvVar12 = std::get<0ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 &p_Var15[1]._M_left);
                            *(variant_alternative_t<0UL,_variant<int,_VarId>_> *)(puVar5 + 4) =
                                 *pvVar12;
                            *(undefined1 *)(puVar5 + 6) = 0;
                            std::get<0ul,int,mir::inst::VarId>(pvVar22);
                          }
                          else {
                            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                               ((variant<int,_mir::inst::VarId> *)
                                                &p_Var15[1]._M_left);
                            puVar5[4] = &PTR_display_001eb100;
                            *(uint32_t *)(puVar5 + 5) = pvVar8->id;
                            *(undefined1 *)(puVar5 + 6) = 1;
                            std::get<1ul,int,mir::inst::VarId>(pvVar22);
                          }
                        }
                      }
                    }
                  }
                }
                else if (p_Var15 == local_178) {
                  if (*(char *)(puVar5 + 6) == '\x01') {
                    pvVar22 = (variant<int,_mir::inst::VarId> *)(puVar5 + 4);
                    pvVar8 = std::get<1ul,int,mir::inst::VarId>(pvVar22);
                    if (local_b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0
                       ) {
                      uVar2 = pvVar8->id;
                      p_Var15 = &p_Var1->_M_header;
                      p_Var7 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                      do {
                        p_Var20 = p_Var7;
                        p_Var17 = p_Var15;
                        uVar3 = *(uint *)&p_Var20[1]._M_parent;
                        p_Var15 = p_Var20;
                        if (uVar3 < uVar2) {
                          p_Var15 = p_Var17;
                        }
                        p_Var7 = (&p_Var20->_M_left)[uVar3 < uVar2];
                      } while ((&p_Var20->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
                        if (uVar3 < uVar2) {
                          p_Var20 = p_Var17;
                        }
                        if (*(uint *)&p_Var20[1]._M_parent <= uVar2) {
                          if ((char)p_Var15[2]._M_color == _S_red) {
                            pvVar12 = std::get<0ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 &p_Var15[1]._M_left);
                            *(variant_alternative_t<0UL,_variant<int,_VarId>_> *)(puVar5 + 4) =
                                 *pvVar12;
                            *(undefined1 *)(puVar5 + 6) = 0;
                            std::get<0ul,int,mir::inst::VarId>(pvVar22);
                          }
                          else {
                            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                               ((variant<int,_mir::inst::VarId> *)
                                                &p_Var15[1]._M_left);
                            puVar5[4] = &PTR_display_001eb100;
                            *(uint32_t *)(puVar5 + 5) = pvVar8->id;
                            *(undefined1 *)(puVar5 + 6) = 1;
                            std::get<1ul,int,mir::inst::VarId>(pvVar22);
                          }
                        }
                      }
                    }
                  }
                }
                else if ((p_Var15 == local_40) && (*(char *)(puVar5 + 8) == '\x01')) {
                  pvVar22 = (variant<int,_mir::inst::VarId> *)(puVar5 + 6);
                  pvVar8 = std::get<1ul,int,mir::inst::VarId>(pvVar22);
                  if (local_b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
                  {
                    uVar2 = pvVar8->id;
                    p_Var15 = &p_Var1->_M_header;
                    p_Var7 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                    do {
                      p_Var20 = p_Var7;
                      p_Var17 = p_Var15;
                      uVar3 = *(uint *)&p_Var20[1]._M_parent;
                      p_Var15 = p_Var20;
                      if (uVar3 < uVar2) {
                        p_Var15 = p_Var17;
                      }
                      p_Var7 = (&p_Var20->_M_left)[uVar3 < uVar2];
                    } while ((&p_Var20->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                    if ((_Rb_tree_header *)p_Var15 != p_Var1) {
                      if (uVar3 < uVar2) {
                        p_Var20 = p_Var17;
                      }
                      if (*(uint *)&p_Var20[1]._M_parent <= uVar2) {
                        if ((char)p_Var15[2]._M_color == _S_red) {
                          pvVar12 = std::get<0ul,int,mir::inst::VarId>
                                              ((variant<int,_mir::inst::VarId> *)&p_Var15[1]._M_left
                                              );
                          *(variant_alternative_t<0UL,_variant<int,_VarId>_> *)(puVar5 + 6) =
                               *pvVar12;
                          *(undefined1 *)(puVar5 + 8) = 0;
                          std::get<0ul,int,mir::inst::VarId>(pvVar22);
                        }
                        else {
                          pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                             ((variant<int,_mir::inst::VarId> *)&p_Var15[1]._M_left)
                          ;
                          puVar5[6] = &PTR_display_001eb100;
                          *(uint32_t *)(puVar5 + 7) = pvVar8->id;
                          *(undefined1 *)(puVar5 + 8) = 1;
                          std::get<1ul,int,mir::inst::VarId>(pvVar22);
                        }
                      }
                    }
                  }
                }
              }
              local_1b4 = local_1b4 + 1;
              p_Var14 = (_Base_ptr)&p_Var14->_M_parent;
            } while (p_Var14 != local_c8);
          }
          std::
          _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
          ::~_Rb_tree(&local_b8);
          std::
          _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
          ::~_Rb_tree(&local_88);
          p_Var15 = (_Base_ptr)((long)&local_168->_M_color + 1);
          p_Var14 = (_Base_ptr)
                    ((long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
        } while (p_Var15 < p_Var14);
        uVar19 = (ulong)((long)iStack_f0._M_current - (long)local_f8) >> 2 & 0xffffffff;
      }
      p_Var14 = local_1b0 + 3;
      while( true ) {
        uVar19 = uVar19 - 1;
        if ((int)(uint)uVar19 < 0) break;
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)&p_Var14->_M_parent,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   (&p_Var14->_M_parent->_M_color +
                   (long)*(int *)((long)local_f8 + (ulong)((uint)uVar19 & 0x7fffffff) * 4) * 2));
      }
      if (local_f8 != (void *)0x0) {
        operator_delete(local_f8,(long)local_e8 - (long)local_f8);
      }
      if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_1b0 = (_Base_ptr)std::_Rb_tree_increment(local_1b0);
      func = local_58;
    } while (local_1b0 != local_d8);
    p_Var1 = &local_128._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_128._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var10 = local_128._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var9 = local_128._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        for (; (_Rb_tree_header *)p_Var10 != p_Var1;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          if (*(int *)&p_Var9[1]._M_parent == *(int *)&p_Var10[1]._M_right) {
            pmVar13 = std::
                      map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                      ::operator[]((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                    *)&local_128,(key_type *)(p_Var10 + 1));
            pmVar13->id = *(uint32_t *)&p_Var9[1]._M_right;
          }
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        p_Var10 = local_128._M_impl.super__Rb_tree_header._M_header._M_left;
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
  }
  p_Var14 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var14 != local_d8) {
    local_168 = (_Base_ptr)&PTR_display_001ed108;
    local_170 = (_Base_ptr)&PTR_display_001ed048;
    local_c8 = (_Base_ptr)&PTR_display_001ed1c8;
    local_178 = (_Base_ptr)&PTR_display_001ed288;
    local_130 = (_Base_ptr)&PTR_display_001ed348;
    local_138 = (_Base_ptr)&PTR_display_001ed3a8;
    do {
      p_Var15 = p_Var14[3]._M_parent;
      local_d0 = p_Var14;
      p_Var14 = p_Var14[3]._M_left;
      for (; p_Var15 != p_Var14; p_Var15 = (_Base_ptr)&p_Var15->_M_parent) {
        puVar5 = *(undefined8 **)p_Var15;
        p_Var7 = (_Base_ptr)*puVar5;
        if (p_Var7 == (_Base_ptr)&PTR_display_001ecfe8) {
          if (*(char *)(puVar5 + 6) == '\x01') {
            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)(puVar5 + 4));
            if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              uVar2 = pvVar8->id;
              p_Var1 = &local_128._M_impl.super__Rb_tree_header;
              p_Var7 = &p_Var1->_M_header;
              p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var17 = p_Var20;
                p_Var18 = p_Var7;
                uVar3 = *(uint *)&p_Var17[1]._M_parent;
                p_Var7 = p_Var17;
                if (uVar3 < uVar2) {
                  p_Var7 = p_Var18;
                }
                p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
              } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var7 != p_Var1) {
                if (uVar3 < uVar2) {
                  p_Var17 = p_Var18;
                }
                if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                  puVar5[4] = &PTR_display_001eb100;
                  *(undefined4 *)(puVar5 + 5) = *(undefined4 *)&p_Var7[1]._M_right;
                  *(undefined1 *)(puVar5 + 6) = 1;
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)(puVar5 + 4))
                  ;
                }
              }
            }
          }
        }
        else if (p_Var7 == local_168) {
          lVar11 = puVar5[7];
          if (puVar5[8] != lVar11) {
            uVar19 = 0;
            do {
              lVar16 = uVar19 * 0x20;
              if ((*(char *)(lVar11 + 0x18 + lVar16) == '\x01') &&
                 (pvVar8 = std::get<1ul,int,mir::inst::VarId>
                                     ((variant<int,_mir::inst::VarId> *)(lVar11 + lVar16 + 8)),
                 local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)) {
                uVar2 = pvVar8->id;
                p_Var7 = &local_128._M_impl.super__Rb_tree_header._M_header;
                p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
                do {
                  p_Var17 = p_Var20;
                  p_Var18 = p_Var7;
                  uVar3 = *(uint *)&p_Var17[1]._M_parent;
                  p_Var7 = p_Var17;
                  if (uVar3 < uVar2) {
                    p_Var7 = p_Var18;
                  }
                  p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
                } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                if ((_Rb_tree_header *)p_Var7 != &local_128._M_impl.super__Rb_tree_header) {
                  if (uVar3 < uVar2) {
                    p_Var17 = p_Var18;
                  }
                  if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                    lVar16 = puVar5[7] + lVar16;
                    *(undefined ***)
                     &(((variant<int,_mir::inst::VarId> *)(lVar16 + 8))->
                      super__Variant_base<int,_mir::inst::VarId>).
                      super__Move_assign_alias<int,_mir::inst::VarId>.
                      super__Copy_assign_alias<int,_mir::inst::VarId>.
                      super__Move_ctor_alias<int,_mir::inst::VarId>.
                      super__Copy_ctor_alias<int,_mir::inst::VarId>.
                      super__Variant_storage_alias<int,_mir::inst::VarId>._M_u =
                         &PTR_display_001eb100;
                    *(undefined4 *)(lVar16 + 0x10) = *(undefined4 *)&p_Var7[1]._M_right;
                    *(undefined1 *)(lVar16 + 0x18) = 1;
                    std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)(lVar16 + 8));
                  }
                }
              }
              uVar19 = uVar19 + 1;
              lVar11 = puVar5[7];
            } while (uVar19 < (ulong)(puVar5[8] - lVar11 >> 5));
          }
        }
        else if (p_Var7 == local_170) {
          if (*(char *)(puVar5 + 6) == '\x01') {
            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)(puVar5 + 4));
            if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              uVar2 = pvVar8->id;
              p_Var1 = &local_128._M_impl.super__Rb_tree_header;
              p_Var7 = &p_Var1->_M_header;
              p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var17 = p_Var20;
                p_Var18 = p_Var7;
                uVar3 = *(uint *)&p_Var17[1]._M_parent;
                p_Var7 = p_Var17;
                if (uVar3 < uVar2) {
                  p_Var7 = p_Var18;
                }
                p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
              } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var7 != p_Var1) {
                if (uVar3 < uVar2) {
                  p_Var17 = p_Var18;
                }
                if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                  puVar5[4] = &PTR_display_001eb100;
                  *(undefined4 *)(puVar5 + 5) = *(undefined4 *)&p_Var7[1]._M_right;
                  *(undefined1 *)(puVar5 + 6) = 1;
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)(puVar5 + 4))
                  ;
                }
              }
            }
          }
          if (*(char *)(puVar5 + 10) == '\x01') {
            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)(puVar5 + 8));
            if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              uVar2 = pvVar8->id;
              p_Var1 = &local_128._M_impl.super__Rb_tree_header;
              p_Var7 = &p_Var1->_M_header;
              p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var17 = p_Var20;
                p_Var18 = p_Var7;
                uVar3 = *(uint *)&p_Var17[1]._M_parent;
                p_Var7 = p_Var17;
                if (uVar3 < uVar2) {
                  p_Var7 = p_Var18;
                }
                p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
              } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var7 != p_Var1) {
                if (uVar3 < uVar2) {
                  p_Var17 = p_Var18;
                }
                if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                  puVar5[8] = &PTR_display_001eb100;
                  *(undefined4 *)(puVar5 + 9) = *(undefined4 *)&p_Var7[1]._M_right;
                  *(undefined1 *)(puVar5 + 10) = 1;
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)(puVar5 + 8))
                  ;
                }
              }
            }
          }
        }
        else if (p_Var7 == local_c8) {
          if (*(char *)(puVar5 + 6) == '\x01') {
            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)(puVar5 + 4));
            if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              uVar2 = pvVar8->id;
              p_Var1 = &local_128._M_impl.super__Rb_tree_header;
              p_Var7 = &p_Var1->_M_header;
              p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var17 = p_Var20;
                p_Var18 = p_Var7;
                uVar3 = *(uint *)&p_Var17[1]._M_parent;
                p_Var7 = p_Var17;
                if (uVar3 < uVar2) {
                  p_Var7 = p_Var18;
                }
                p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
              } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var7 != p_Var1) {
                if (uVar3 < uVar2) {
                  p_Var17 = p_Var18;
                }
                if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                  puVar5[4] = &PTR_display_001eb100;
                  *(undefined4 *)(puVar5 + 5) = *(undefined4 *)&p_Var7[1]._M_right;
                  *(undefined1 *)(puVar5 + 6) = 1;
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)(puVar5 + 4))
                  ;
                }
              }
            }
          }
        }
        else if (p_Var7 == local_178) {
          if (*(char *)(puVar5 + 6) == '\x01') {
            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)(puVar5 + 4));
            if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              uVar2 = pvVar8->id;
              p_Var1 = &local_128._M_impl.super__Rb_tree_header;
              p_Var7 = &p_Var1->_M_header;
              p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var17 = p_Var20;
                p_Var18 = p_Var7;
                uVar3 = *(uint *)&p_Var17[1]._M_parent;
                p_Var7 = p_Var17;
                if (uVar3 < uVar2) {
                  p_Var7 = p_Var18;
                }
                p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
              } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var7 != p_Var1) {
                if (uVar3 < uVar2) {
                  p_Var17 = p_Var18;
                }
                if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                  puVar5[4] = &PTR_display_001eb100;
                  *(undefined4 *)(puVar5 + 5) = *(undefined4 *)&p_Var7[1]._M_right;
                  *(undefined1 *)(puVar5 + 6) = 1;
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)(puVar5 + 4))
                  ;
                }
              }
            }
          }
        }
        else if (p_Var7 == local_130) {
          if (*(char *)(puVar5 + 8) == '\x01') {
            pvVar8 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)(puVar5 + 6));
            if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
            goto LAB_001360e2;
            uVar2 = pvVar8->id;
            p_Var1 = &local_128._M_impl.super__Rb_tree_header;
            p_Var7 = &p_Var1->_M_header;
            p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              p_Var17 = p_Var20;
              p_Var18 = p_Var7;
              uVar3 = *(uint *)&p_Var17[1]._M_parent;
              p_Var7 = p_Var17;
              if (uVar3 < uVar2) {
                p_Var7 = p_Var18;
              }
              p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
            } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var7 != p_Var1) {
              if (uVar3 < uVar2) {
                p_Var17 = p_Var18;
              }
              if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                puVar5[6] = &PTR_display_001eb100;
                *(undefined4 *)(puVar5 + 7) = *(undefined4 *)&p_Var7[1]._M_right;
                *(undefined1 *)(puVar5 + 8) = 1;
                std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)(puVar5 + 6));
              }
            }
          }
          if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            uVar2 = *(uint *)(puVar5 + 4);
            p_Var1 = &local_128._M_impl.super__Rb_tree_header;
            p_Var7 = &p_Var1->_M_header;
            p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              p_Var17 = p_Var20;
              p_Var18 = p_Var7;
              uVar3 = *(uint *)&p_Var17[1]._M_parent;
              p_Var7 = p_Var17;
              if (uVar3 < uVar2) {
                p_Var7 = p_Var18;
              }
              p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
            } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var7 != p_Var1) {
              if (uVar3 < uVar2) {
                p_Var17 = p_Var18;
              }
              if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                *(undefined4 *)(puVar5 + 4) = *(undefined4 *)&p_Var7[1]._M_right;
              }
            }
          }
        }
        else if (p_Var7 == local_138) {
          lVar11 = puVar5[5];
          lVar16 = puVar5[6] - lVar11;
          if (lVar16 != 0) {
            lVar16 = lVar16 >> 4;
            lVar21 = 0;
            do {
              if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                puVar23 = (uint *)(lVar21 * 0x10 + lVar11 + 8);
                uVar2 = *puVar23;
                p_Var1 = &local_128._M_impl.super__Rb_tree_header;
                p_Var7 = &p_Var1->_M_header;
                p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
                do {
                  p_Var17 = p_Var20;
                  p_Var18 = p_Var7;
                  uVar3 = *(uint *)&p_Var17[1]._M_parent;
                  p_Var7 = p_Var17;
                  if (uVar3 < uVar2) {
                    p_Var7 = p_Var18;
                  }
                  p_Var20 = (&p_Var17->_M_left)[uVar3 < uVar2];
                } while ((&p_Var17->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                if ((_Rb_tree_header *)p_Var7 != p_Var1) {
                  if (uVar3 < uVar2) {
                    p_Var17 = p_Var18;
                  }
                  if (*(uint *)&p_Var17[1]._M_parent <= uVar2) {
                    *puVar23 = *(uint *)&p_Var7[1]._M_right;
                  }
                }
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 != lVar16 + (ulong)(lVar16 == 0));
          }
        }
LAB_001360e2:
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(local_d0);
    } while (p_Var14 != local_d8);
  }
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::~_Rb_tree(&local_128);
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    /*
    store val to s_dest
    l_dest = load src
    if src is the same as s_dest
    l_dest can be repalced by val to
      1. the next store has same s_dest
      2. call
      3. end of the block
    */
    std::map<mir::types::LabelId, mir::inst::BasicBlk>::iterator bit;
    std::map<mir::inst::VarId, mir::inst::VarId> reg_load;
    for (bit = func.basic_blks.begin(); bit != func.basic_blks.end(); bit++) {
      auto& bb = bit->second;
      // calculate call num
      int index = 0;
      std::vector<int> call_index;
      call_index.push_back(0);
      for (auto& inst : bb.inst) {
        auto& i = *inst;
        if (auto x = dynamic_cast<mir::inst::CallInst*>(&i)) {
          auto find = unaffected_call.find(x->func);
          if (find == unaffected_call.end()) {
            call_index.push_back(index + 1);
          }
        }
        if (auto x = dynamic_cast<mir::inst::StoreInst*>(&i)) {
          call_index.push_back(index);
        }
        index++;
      }
      std::vector<int> del_index;
      for (int j = 0; j < call_index.size(); j++) {
        int upper_bound =
            (j == (call_index.size() - 1)) ? bb.inst.size() : call_index[j + 1];
        std::map<mir::inst::VarId, std::variant<int32_t, mir::inst::VarId>>
            store;
        std::map<mir::inst::VarId, std::variant<int32_t, mir::inst::VarId>>
            load;
        std::map<mir::inst::VarId,
                 std::variant<int32_t, mir::inst::VarId>>::iterator it;
        index = 0;
        for (auto& inst : bb.inst) {
          if (index >= call_index[j] && index < upper_bound) {
            auto& i = *inst;
            if (auto x = dynamic_cast<mir::inst::StoreInst*>(&i)) {
              std::variant<int32_t, mir::inst::VarId> value;
              if (x->val.index() == 1) {
                value.emplace<1>(std::get<1>(x->val));
              } else {
                value.emplace<0>(std::get<0>(x->val));
              }
              it = store.find(x->dest);
              if (it == store.end()) {
                store.insert(std::map<mir::inst::VarId,
                                      std::variant<int32_t, mir::inst::VarId>>::
                                 value_type(x->dest, value));
              } else {
                store[x->dest] = value;
              }
            } else if (auto x = dynamic_cast<mir::inst::LoadInst*>(&i)) {
              if (x->src.index() == 1) {
                it = store.find(std::get<1>(x->src));
                if (it != store.end()) {
                  std::map<mir::inst::VarId,
                           std::variant<int32_t, mir::inst::VarId>>::iterator
                      iter;
                  iter = load.find(x->dest);
                  if (iter == load.end()) {
                    load.insert(
                        std::map<mir::inst::VarId,
                                 std::variant<int32_t, mir::inst::VarId>>::
                            value_type(x->dest, it->second));
                    if (it->second.index() == 1) {
                      reg_load.insert(
                          std::map<mir::inst::VarId, mir::inst::VarId>::
                              value_type(x->dest, std::get<1>(it->second)));
                    }
                  } else {
                    load[x->dest] = it->second;
                  }
                  if (it->second.index() == 1) {
                    del_index.push_back(index);
                  }
                } else {
                  std::variant<int32_t, mir::inst::VarId> value;
                  value.emplace<1>(x->dest);
                  if (x->src.index() == 1) {
                    store.insert(
                        std::map<mir::inst::VarId,
                                 std::variant<int32_t, mir::inst::VarId>>::
                            value_type(std::get<1>(x->src), value));
                  }
                }
              }
            }
          }
          index++;
        }
        for (it = load.begin(); it != load.end(); it++) {
          std::map<mir::inst::VarId,
                   std::variant<int32_t, mir::inst::VarId>>::iterator iet;
          for (iet = load.begin(); iet != load.end(); iet++) {
            if (iet->second.index() == 1 &&
                it->first == std::get<1>(iet->second)) {
              load[iet->first] = it->second;
            }
          }
        }
        // replace
        index = 0;
        for (auto& inst : bb.inst) {
          if (index >= call_index[j] && index < upper_bound) {
            auto& i = *inst;
            if (auto x = dynamic_cast<mir::inst::AssignInst*>(&i)) {
              if (x->src.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->src));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->src.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->src.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::CallInst*>(&i)) {
              for (int j = 0; j < x->params.size(); j++) {
                if (x->params[j].index() == 1) {
                  std::map<mir::inst::VarId,
                           std::variant<int32_t, mir::inst::VarId>>::iterator
                      lit = load.find(std::get<1>(x->params[j]));
                  if (lit != load.end()) {
                    if (lit->second.index() == 0) {
                      x->params[j].emplace<0>(std::get<0>(lit->second));
                    } else {
                      x->params[j].emplace<1>(std::get<1>(lit->second));
                    }
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::OpInst*>(&i)) {
              if (x->lhs.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->lhs));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->lhs.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->lhs.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
              if (x->rhs.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->rhs));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->rhs.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->rhs.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::LoadInst*>(&i)) {
              if (x->src.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->src));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->src.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->src.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::StoreInst*>(&i)) {
              if (x->val.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->val));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->val.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->val.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::PtrOffsetInst*>(&i)) {
              if (x->offset.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->offset));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->offset.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->offset.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            }
          }
          index++;
        }
      }
      // delete load
      for (int i = del_index.size() - 1; i >= 0; i--) {
        auto iter = bit->second.inst.begin() + del_index[i];
        bit->second.inst.erase(iter);
      }
    }
    std::map<mir::inst::VarId, mir::inst::VarId>::iterator iet;
    for (iet = reg_load.begin(); iet != reg_load.end(); iet++) {
      std::map<mir::inst::VarId, mir::inst::VarId>::iterator iet1;
      for (iet1 = reg_load.begin(); iet1 != reg_load.end(); iet1++) {
        if (iet->first == iet1->second) {
          reg_load[iet1->first] = iet->second;
        }
      }
    }
    for (bit = func.basic_blks.begin(); bit != func.basic_blks.end(); bit++) {
      auto& bb = bit->second;
      for (auto& inst : bb.inst) {
        auto& i = *inst;
        if (auto x = dynamic_cast<mir::inst::AssignInst*>(&i)) {
          if (x->src.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->src));
            if (lit != reg_load.end()) {
              x->src.emplace<1>(lit->second);
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::CallInst*>(&i)) {
          for (int j = 0; j < x->params.size(); j++) {
            if (x->params[j].index() == 1) {
              std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                  reg_load.find(std::get<1>(x->params[j]));
              if (lit != reg_load.end()) {
                x->params[j].emplace<1>(lit->second);
              }
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::OpInst*>(&i)) {
          if (x->lhs.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->lhs));
            if (lit != reg_load.end()) {
              x->lhs.emplace<1>(lit->second);
            }
          }
          if (x->rhs.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->rhs));
            if (lit != reg_load.end()) {
              x->rhs.emplace<1>(lit->second);
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::LoadInst*>(&i)) {
          if (x->src.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->src));
            if (lit != reg_load.end()) {
              x->src.emplace<1>(lit->second);
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::StoreInst*>(&i)) {
          if (x->val.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->val));
            if (lit != reg_load.end()) {
              x->val.emplace<1>(lit->second);
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::PtrOffsetInst*>(&i)) {
          if (x->offset.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->offset));
            if (lit != reg_load.end()) {
              x->offset.emplace<1>(lit->second);
            }
          }
          std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
              reg_load.find(x->ptr);
          if (lit != reg_load.end()) {
            x->ptr = lit->second;
          }
        } else if (auto x = dynamic_cast<mir::inst::PhiInst*>(&i)) {
          for (int j = 0; j < x->vars.size(); j++) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(x->vars[j]);
            if (lit != reg_load.end()) {
              x->vars[j] = lit->second;
            }
          }
        }
      }
    }
  }